

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericMouseInput.cpp
# Opt level: O0

void __thiscall fw::GenericMouseInput::nextFrame(GenericMouseInput *this)

{
  tvec2<double,_(glm::precision)0> tVar1;
  double local_20;
  double local_18;
  GenericMouseInput *this_local;
  
  changeTapsToPresses(this);
  (this->_previousPosition).field_0.field_0.x = (this->_currentPosition).field_0.field_0.x;
  (this->_previousPosition).field_0.field_0.y = (this->_currentPosition).field_0.field_0.y;
  tVar1 = glm::operator-(&this->_currentPosition,&this->_previousPosition);
  local_20 = tVar1.field_0._0_8_;
  (this->_movement).field_0.field_0.x = local_20;
  local_18 = tVar1.field_0._8_8_;
  (this->_movement).field_0.field_0.y = local_18;
  return;
}

Assistant:

void GenericMouseInput::nextFrame()
{
    changeTapsToPresses();
    _previousPosition = _currentPosition;
    _movement = _currentPosition - _previousPosition;
}